

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkDropTable(Parse *pParse,SrcList *pName,Table *pTab)

{
  Vdbe *p_00;
  FKey *pFVar1;
  long in_RDX;
  Parse *in_RSI;
  sqlite3 *in_RDI;
  FKey *p;
  Vdbe *v;
  int iSkip;
  sqlite3 *db;
  Expr *in_stack_000000c8;
  ExprList *in_stack_000000d0;
  Expr *in_stack_000000d8;
  SrcList *in_stack_000000e0;
  Parse *in_stack_000000e8;
  Parse *in_stack_ffffffffffffffb8;
  Vdbe *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  long lVar2;
  int x;
  Vdbe *v_00;
  int iVar3;
  sqlite3 *p4;
  sqlite3 *psVar4;
  
  x = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  p4 = (sqlite3 *)in_RDI->pVfs;
  if (((p4->flags & 0x4000) != 0) && (*(char *)(in_RDX + 0x3f) == '\0')) {
    iVar3 = 0;
    p_00 = sqlite3GetVdbe(in_stack_ffffffffffffffb8);
    pFVar1 = sqlite3FkReferences((Table *)0x1e579c);
    if (pFVar1 == (FKey *)0x0) {
      lVar2 = *(long *)(in_RDX + 0x48);
      while (((lVar2 != 0 && (*(char *)(lVar2 + 0x2c) == '\0')) && ((p4->flags & 0x80000) == 0))) {
        lVar2 = *(long *)(lVar2 + 8);
      }
      if (lVar2 == 0) {
        return;
      }
      iVar3 = sqlite3VdbeMakeLabel((Parse *)in_RDI);
      x = (int)((ulong)lVar2 >> 0x20);
      sqlite3VdbeAddOp2(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                        (int)in_stack_ffffffffffffffb8,0);
    }
    *(undefined1 *)((long)&in_RDI->nExtension + 1) = 1;
    psVar4 = in_RDI;
    sqlite3SrcListDup(in_RDI,(SrcList *)in_RSI,(int)((ulong)in_RDX >> 0x20));
    sqlite3DeleteFrom(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                      in_stack_000000c8);
    *(undefined1 *)((long)&psVar4->nExtension + 1) = 0;
    v_00 = p_00;
    if ((p4->flags & 0x80000) == 0) {
      sqlite3VdbeCurrentAddr(p_00);
      sqlite3VdbeAddOp2((Vdbe *)in_RDI,(int)((ulong)p_00 >> 0x20),(int)p_00,0);
      sqlite3HaltConstraint
                (in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,(char *)p4,
                 (i8)((uint)iVar3 >> 0x18),(u8)((uint)iVar3 >> 0x10));
    }
    if (iVar3 != 0) {
      sqlite3VdbeResolveLabel(v_00,x);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkDropTable(Parse *pParse, SrcList *pName, Table *pTab){
  sqlite3 *db = pParse->db;
  if( (db->flags&SQLITE_ForeignKeys) && IsOrdinaryTable(pTab) ){
    int iSkip = 0;
    Vdbe *v = sqlite3GetVdbe(pParse);

    assert( v );                  /* VDBE has already been allocated */
    assert( IsOrdinaryTable(pTab) );
    if( sqlite3FkReferences(pTab)==0 ){
      /* Search for a deferred foreign key constraint for which this table
      ** is the child table. If one cannot be found, return without
      ** generating any VDBE code. If one can be found, then jump over
      ** the entire DELETE if there are no outstanding deferred constraints
      ** when this statement is run.  */
      FKey *p;
      for(p=pTab->u.tab.pFKey; p; p=p->pNextFrom){
        if( p->isDeferred || (db->flags & SQLITE_DeferFKs) ) break;
      }
      if( !p ) return;
      iSkip = sqlite3VdbeMakeLabel(pParse);
      sqlite3VdbeAddOp2(v, OP_FkIfZero, 1, iSkip); VdbeCoverage(v);
    }

    pParse->disableTriggers = 1;
    sqlite3DeleteFrom(pParse, sqlite3SrcListDup(db, pName, 0), 0, 0, 0);
    pParse->disableTriggers = 0;

    /* If the DELETE has generated immediate foreign key constraint
    ** violations, halt the VDBE and return an error at this point, before
    ** any modifications to the schema are made. This is because statement
    ** transactions are not able to rollback schema changes.
    **
    ** If the SQLITE_DeferFKs flag is set, then this is not required, as
    ** the statement transaction will not be rolled back even if FK
    ** constraints are violated.
    */
    if( (db->flags & SQLITE_DeferFKs)==0 ){
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      sqlite3VdbeAddOp2(v, OP_FkIfZero, 0, sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
      sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
          OE_Abort, 0, P4_STATIC, P5_ConstraintFK);
    }

    if( iSkip ){
      sqlite3VdbeResolveLabel(v, iSkip);
    }
  }
}